

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.h
# Opt level: O1

void __thiscall jbcoin::Serializer::Serializer(Serializer *this,int n)

{
  (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(&this->mData,(long)n);
  return;
}

Assistant:

explicit
    Serializer (int n = 256)
    {
        mData.reserve (n);
    }